

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_noise_strength_lut_init(aom_noise_strength_lut_t *lut,int num_points)

{
  void *pvVar1;
  int in_ESI;
  long *in_RDI;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else if (in_ESI < 1) {
    local_4 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 1) = 0;
    pvVar1 = aom_malloc(0x3a2cea);
    *in_RDI = (long)pvVar1;
    if (*in_RDI == 0) {
      local_4 = 0;
    }
    else {
      *(int *)(in_RDI + 1) = in_ESI;
      memset((void *)*in_RDI,0,(long)in_ESI << 4);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int aom_noise_strength_lut_init(aom_noise_strength_lut_t *lut, int num_points) {
  if (!lut) return 0;
  if (num_points <= 0) return 0;
  lut->num_points = 0;
  lut->points = (double(*)[2])aom_malloc(num_points * sizeof(*lut->points));
  if (!lut->points) return 0;
  lut->num_points = num_points;
  memset(lut->points, 0, sizeof(*lut->points) * num_points);
  return 1;
}